

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

void Cipher::printDecoded(TClusters *t,TClusterToLetterMap *clMap,THint *hint)

{
  uint uVar1;
  int i;
  int idx;
  uint __c;
  
  for (idx = 0; idx < (int)((ulong)((long)(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                          .super__Vector_impl_data._M_finish -
                                   (long)(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start) >> 2); idx = idx + 1) {
    uVar1 = decode(t,idx,clMap,hint);
    __c = 0x2e;
    if (uVar1 == 0x1b) {
      __c = 0x5f;
    }
    if (uVar1 - 1 < 0x1a) {
      __c = uVar1 | 0x60;
    }
    putchar(__c);
  }
  return;
}

Assistant:

void printDecoded(const TClusters & t, const TClusterToLetterMap & clMap, const THint & hint) {
        for (int i = 0; i < (int) t.size(); ++i) {
            const auto let = decode(t, i, clMap, hint);

            if (let >= 1 && let <= 26) {
                printf("%c", 'a' + let - 1);
            } else if (let == 27) {
                printf("_");
            } else {
                printf(".");
            }
        }
    }